

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_(run_for_at_least_argument_t<system_clock,_repeater<now<system_clock>_>_>)>
 nonius::detail::
 run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>>
           (parameters *params,Duration<std::chrono::_V2::system_clock> how_long,int seed,
           repeater<nonius::now<std::chrono::_V2::system_clock>_> *fun)

{
  bool bVar1;
  optimized_away_error *this;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RDI;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_&(int)>
  *timing;
  int iters;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff88;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff90;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_&(int)>
  local_50;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_&(int)>
  *local_40;
  int local_34;
  undefined8 local_30;
  undefined8 local_20;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>_>_(run_for_at_least_argument_t<system_clock,_repeater<now<system_clock>_>_>)>
  local_10;
  
  local_34 = in_EDX;
  local_30 = in_RCX;
  local_20 = in_RDI;
  while( true ) {
    if (0x3fffffff < local_34) {
      this = (optimized_away_error *)__cxa_allocate_exception(8);
      memset(this,0,8);
      optimized_away_error::optimized_away_error(this);
      __cxa_throw(this,&optimized_away_error::typeinfo,optimized_away_error::~optimized_away_error);
    }
    local_50 = measure_one<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>&>
                         (local_30,local_34,local_20);
    local_40 = &local_50;
    bVar1 = std::chrono::operator>=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (bVar1) break;
    local_34 = local_34 << 1;
  }
  timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_nonius::detail::complete_type<void>::type>
  ::timing(&local_10,(local_40->elapsed).__r,local_34);
  return local_10;
}

Assistant:

TimingOf<Clock, Fun(run_for_at_least_argument_t<Clock, Fun>)> run_for_at_least(const parameters& params, Duration<Clock> how_long, int seed, Fun&& fun) {
            auto iters = seed;
            while(iters < (1 << 30)) {
                auto&& timing = measure_one<Clock>(fun, iters, params, detail::is_callable<Fun(chronometer)>());

                if(timing.elapsed >= how_long) {
                    return { timing.elapsed, std::move(timing.result), iters };
                }
                iters *= 2;
            }
            throw optimized_away_error{};
        }